

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O3

deUint32 vkt::image::getNumLayers(ImageType imageType,UVec3 *imageSize)

{
  switch(imageType) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_2D:
  case IMAGE_TYPE_3D:
  case IMAGE_TYPE_BUFFER:
    return 1;
  case IMAGE_TYPE_1D_ARRAY:
  case IMAGE_TYPE_2D_ARRAY:
    return imageSize->m_data[2];
  case IMAGE_TYPE_CUBE:
    return 6;
  case IMAGE_TYPE_CUBE_ARRAY:
    return imageSize->m_data[2] * 6;
  default:
    return 0;
  }
}

Assistant:

deUint32 getNumLayers (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_3D:
		case IMAGE_TYPE_BUFFER:
			return 1u;

		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D_ARRAY:
			return imageSize.z();

		case IMAGE_TYPE_CUBE:
			return 6u;

		case IMAGE_TYPE_CUBE_ARRAY:
			return imageSize.z() * 6u;

		default:
			DE_FATAL("Unknown image type");
			return 0u;
	}
}